

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::OP_StFunctionExpression(Var obj,PropertyId propertyId,Var newValue)

{
  ScriptContext *this;
  ThreadContext *threadContext;
  undefined1 local_48 [8];
  JsReentLock reentrancylock;
  RecyclableObject *instance;
  Var newValue_local;
  PropertyId propertyId_local;
  Var obj_local;
  
  reentrancylock._24_8_ = VarTo<Js::RecyclableObject>(obj);
  this = RecyclableObject::GetScriptContext((RecyclableObject *)reentrancylock._24_8_);
  threadContext = ScriptContext::GetThreadContext(this);
  JsReentLock::JsReentLock((JsReentLock *)local_48,threadContext);
  (**(code **)(*(long *)reentrancylock._24_8_ + 0xb8))
            (reentrancylock._24_8_,propertyId,newValue,0,0);
  (**(code **)(*(long *)reentrancylock._24_8_ + 0x1d8))(reentrancylock._24_8_,propertyId,0);
  (**(code **)(*(long *)reentrancylock._24_8_ + 0x1e0))(reentrancylock._24_8_,propertyId,0);
  JsReentLock::~JsReentLock((JsReentLock *)local_48);
  return 1;
}

Assistant:

BOOL JavascriptOperators::OP_StFunctionExpression(Var obj, PropertyId propertyId, Var newValue)
    {
        RecyclableObject* instance = VarTo<RecyclableObject>(obj);
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_StFunctionExpression, reentrancylock, instance->GetScriptContext()->GetThreadContext());

        instance->SetProperty(propertyId, newValue, PropertyOperation_None, NULL);
        instance->SetWritable(propertyId, FALSE);
        instance->SetConfigurable(propertyId, FALSE);

        return TRUE;
        JIT_HELPER_END(Op_StFunctionExpression);
    }